

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_curse_values(parser *p)

{
  errr eVar1;
  errr eVar2;
  void *pvVar3;
  char *pcVar4;
  parser_error pVar5;
  wchar_t index;
  wchar_t value;
  char *local_38;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar5 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar4 = parser_getstr(p,"values");
    local_38 = string_make(pcVar4);
    pcVar4 = strtok(local_38," |");
    while (pcVar4 != (char *)0x0) {
      value = L'\0';
      index = L'\0';
      eVar1 = grab_index_and_int(&value,&index,obj_mods,"",pcVar4);
      if (eVar1 == 0) {
        *(undefined2 *)(*(long *)((long)pvVar3 + 0x18) + 0x52 + (long)index * 2) = (undefined2)value
        ;
      }
      eVar2 = grab_index_and_int(&value,&index,element_names,"RES_",pcVar4);
      if (eVar2 == 0) {
        *(undefined2 *)(*(long *)((long)pvVar3 + 0x18) + 0x72 + (long)index * 4) = (undefined2)value
        ;
      }
      else if (eVar1 != 0) {
        pVar5 = PARSE_ERROR_INVALID_VALUE;
        goto LAB_00183368;
      }
      pcVar4 = strtok((char *)0x0," |");
    }
    pVar5 = PARSE_ERROR_NONE;
LAB_00183368:
    string_free(local_38);
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_curse_values(struct parser *p) {
	struct curse *curse = parser_priv(p);
	char *s, *t;

	if (!curse) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	s = string_make(parser_getstr(p, "values"));
	t = strtok(s, " |");

	while (t) {
		int value = 0;
		int index = 0;
		bool found = false;
		if (!grab_index_and_int(&value, &index, obj_mods, "", t)) {
			found = true;
			curse->obj->modifiers[index] = value;
		}
		if (!grab_index_and_int(&value, &index, element_names, "RES_", t)) {
			found = true;
			curse->obj->el_info[index].res_level = value;
		}
		if (!found) {
			break;
		}
		t = strtok(NULL, " |");
	}

	string_free(s);
	return t ? PARSE_ERROR_INVALID_VALUE : PARSE_ERROR_NONE;
}